

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::addMoleculeStamp(SimInfo *this,MoleculeStamp *molStamp,int nmol)

{
  pointer *pppMVar1;
  iterator __position;
  int curStampId;
  int local_1c;
  MoleculeStamp *local_18;
  
  __position._M_current =
       (this->moleculeStamps_).
       super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_1c = (int)((ulong)((long)__position._M_current -
                          (long)(this->moleculeStamps_).
                                super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_18 = molStamp;
  if (__position._M_current ==
      (this->moleculeStamps_).
      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMD::MoleculeStamp*,std::allocator<OpenMD::MoleculeStamp*>>::
    _M_realloc_insert<OpenMD::MoleculeStamp*const&>
              ((vector<OpenMD::MoleculeStamp*,std::allocator<OpenMD::MoleculeStamp*>> *)
               &this->moleculeStamps_,__position,&local_18);
  }
  else {
    *__position._M_current = molStamp;
    pppMVar1 = &(this->moleculeStamps_).
                super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppMVar1 = *pppMVar1 + 1;
  }
  (this->moleculeStamps_).
  super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->ident_ = local_1c;
  std::vector<int,_std::allocator<int>_>::_M_fill_insert
            (&this->molStampIds_,
             (iterator)
             (this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,(long)nmol,&local_1c);
  return;
}

Assistant:

void SimInfo::addMoleculeStamp(MoleculeStamp* molStamp, int nmol) {
    int curStampId;

    // index from 0
    curStampId = moleculeStamps_.size();

    moleculeStamps_.push_back(molStamp);
    moleculeStamps_[moleculeStamps_.size() - 1]->setIdent(curStampId);
    molStampIds_.insert(molStampIds_.end(), nmol, curStampId);
  }